

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void (anonymous_namespace)::
     verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_char)>
               (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uchar *func,char *functionName
               )

{
  undefined8 uVar1;
  char *in_RSI;
  long in_RDI;
  string error;
  char *in_stack_ffffffffffffff28;
  imageException *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  string local_50 [64];
  char *local_10;
  
  if (in_RDI == 0) {
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Function ",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,local_10,&local_a9);
    std::operator+(in_stack_ffffffffffffff38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff30," is not defined",
               (allocator *)&stack0xffffffffffffff2f);
    std::operator+(in_stack_ffffffffffffff38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    uVar1 = __cxa_allocate_exception(0x28);
    std::__cxx11::string::data();
    imageException::imageException(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  return;
}

Assistant:

void verifyFunction(_T func, const char * functionName)
    {
        if ( func == nullptr ) {
            const std::string error( std::string("Function ") + std::string(functionName) + std::string(" is not defined") );
            throw imageException(error.data());
        }
    }